

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkConstructFromCnf(Abc_Ntk_t *pNtk,Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  byte *pbVar2;
  byte bVar3;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  Vec_Int_t *p_00;
  Aig_Obj_t *pAVar6;
  char *pcVar7;
  Vec_Int_t *vCover;
  int iVar8;
  uint nVars;
  Mem_Flex_t *pMan;
  Abc_Ntk_t *pAVar9;
  long lVar10;
  
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pAVar4 = Abc_NtkCreateNodeConst1(pNtk_00);
  (p->pManAig->pConst1->field_5).pData = pAVar4;
  for (iVar8 = 0; iVar8 < pNtk->vCis->nSize; iVar8 = iVar8 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,iVar8);
    aVar1 = pAVar4->field_6;
    pvVar5 = Vec_PtrEntry(p->pManAig->vCis,iVar8);
    *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)((long)pvVar5 + 0x28) = aVar1;
  }
  p_00 = Vec_IntAlloc(0x10000);
  iVar8 = 0;
  do {
    if (vMapped->nSize <= iVar8) {
      Vec_IntFree(p_00);
      for (iVar8 = 0; iVar8 < pNtk->vCos->nSize; iVar8 = iVar8 + 1) {
        pAVar4 = Abc_NtkCo(pNtk,iVar8);
        pvVar5 = Vec_PtrEntry(p->pManAig->vCos,iVar8);
        Abc_ObjAddFanin((pAVar4->field_6).pCopy,
                        (Abc_Obj_t *)
                        ((ulong)((uint)*(ulong *)((long)pvVar5 + 8) & 1) ^
                        *(ulong *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x28)));
      }
      pAVar4 = (Abc_Obj_t *)(p->pManAig->pConst1->field_5).pData;
      if ((pAVar4->vFanouts).nSize == 0) {
        Abc_NtkDeleteObj(pAVar4);
      }
      Abc_NtkLogicMakeSimpleCos(pNtk_00,1);
      pAVar9 = pNtk_00;
      iVar8 = Abc_NtkCheck(pNtk_00);
      if (iVar8 == 0) {
        Abc_Print((int)pAVar9,"Abc_NtkConstructFromCnf(): Network check has failed.\n");
      }
      return pNtk_00;
    }
    pvVar5 = Vec_PtrEntry(vMapped,iVar8);
    pAVar4 = Abc_NtkCreateNode(pNtk_00);
    pbVar2 = *(byte **)((long)pvVar5 + 0x28);
    for (lVar10 = 0; bVar3 = *pbVar2, lVar10 < (char)bVar3; lVar10 = lVar10 + 1) {
      pAVar6 = Aig_ManObj(p->pManAig,*(int *)(pbVar2 + lVar10 * 4 + 0x18));
      if (pAVar6 == (Aig_Obj_t *)0x0) {
        bVar3 = *pbVar2;
        break;
      }
      Abc_ObjAddFanin(pAVar4,(Abc_Obj_t *)(pAVar6->field_5).pData);
    }
    if ((char)bVar3 < '\x05') {
      Cnf_SopConvertToVector
                (p->pSops[*(ushort *)(pbVar2 + (long)(char)bVar3 * 4 + 0x18)],
                 (int)p->pSopSizes[*(ushort *)(pbVar2 + (long)(char)bVar3 * 4 + 0x18)],p_00);
      pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
      nVars = (uint)(char)*pbVar2;
      vCover = p_00;
    }
    else {
      nVars = (uint)bVar3;
      pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
      vCover = *(Vec_Int_t **)(pbVar2 + 0x10);
    }
    pcVar7 = Abc_SopCreateFromIsop(pMan,nVars,vCover);
    (pAVar4->field_5).pData = pcVar7;
    *(Abc_Obj_t **)((long)pvVar5 + 0x28) = pAVar4;
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkConstructFromCnf( Abc_Ntk_t * pNtk, Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pNodeNew;
    Aig_Obj_t * pObj, * pLeaf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover;
    unsigned uTruth;
    int i, k, nDupGates;
    // create the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // make the mapper point to the new network
    Aig_ManConst1(p->pManAig)->pData = Abc_NtkCreateNodeConst1(pNtkNew);
    Abc_NtkForEachCi( pNtk, pNode, i )
        Aig_ManCi(p->pManAig, i)->pData = pNode->pCopy;
    // process the nodes in topological order
    vCover = Vec_IntAlloc( 1 << 16 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        // create new node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        // add fanins according to the cut
        pCut = (Cnf_Cut_t *)pObj->pData;
        Cnf_CutForEachLeaf( p->pManAig, pCut, pLeaf, k )
            Abc_ObjAddFanin( pNodeNew, (Abc_Obj_t *)pLeaf->pData );
        // add logic function
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vCover );
            pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, pCut->nFanins, vCover );
        }
        else
            pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, pCut->nFanins, pCut->vIsop[1] );
        // save the node
        pObj->pData = pNodeNew;
    }
    Vec_IntFree( vCover );
    // add the CO drivers
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pObj = Aig_ManCo(p->pManAig, i);
        pNodeNew = Abc_ObjNotCond( (Abc_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }

    // remove the constant node if not used
    pNodeNew = (Abc_Obj_t *)Aig_ManConst1(p->pManAig)->pData;
    if ( Abc_ObjFanoutNum(pNodeNew) == 0 )
        Abc_NtkDeleteObj( pNodeNew );
    // minimize the node
//    Abc_NtkSweep( pNtkNew, 0 );
    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, 1 );
//    if ( nDupGates && If_ManReadVerbose(pIfMan) )
//        Abc_Print( 1, "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkConstructFromCnf(): Network check has failed.\n" );
    return pNtkNew;
}